

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_freeJobsTable(ZSTDMT_jobDescription *jobTable,U32 nbJobs,ZSTD_customMem cMem)

{
  ulong uVar1;
  pthread_cond_t *__cond;
  bool bVar2;
  
  if (jobTable == (ZSTDMT_jobDescription *)0x0) {
    return;
  }
  uVar1 = (ulong)nbJobs;
  __cond = (pthread_cond_t *)&jobTable->job_cond;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    pthread_mutex_destroy((pthread_mutex_t *)((long)__cond + -0x28));
    pthread_cond_destroy(__cond);
    __cond = (pthread_cond_t *)((long)__cond + 0x178);
  }
  if (cMem.customFree != (ZSTD_freeFunction)0x0) {
    (*cMem.customFree)(cMem.opaque,jobTable);
    return;
  }
  free(jobTable);
  return;
}

Assistant:

static void ZSTDMT_freeJobsTable(ZSTDMT_jobDescription* jobTable, U32 nbJobs, ZSTD_customMem cMem)
{
    U32 jobNb;
    if (jobTable == NULL) return;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        ZSTD_pthread_mutex_destroy(&jobTable[jobNb].job_mutex);
        ZSTD_pthread_cond_destroy(&jobTable[jobNb].job_cond);
    }
    ZSTD_free(jobTable, cMem);
}